

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa_ossl.c
# Opt level: O0

BIGNUM * dsa_mod_inverse_fermat(BIGNUM *k,BIGNUM *q,BN_CTX *ctx)

{
  int iVar1;
  BIGNUM *a;
  BIGNUM *r_00;
  BN_CTX *in_RDX;
  BIGNUM *in_RSI;
  BIGNUM *in_RDI;
  BIGNUM *e;
  BIGNUM *r;
  BIGNUM *res;
  undefined8 local_28;
  undefined8 local_8;
  
  local_28 = (BIGNUM *)0x0;
  a = BN_new();
  if (a == (BIGNUM *)0x0) {
    local_8 = (BIGNUM *)0x0;
  }
  else {
    BN_CTX_start((BN_CTX *)in_RDX);
    r_00 = BN_CTX_get((BN_CTX *)in_RDX);
    if ((((r_00 == (BIGNUM *)0x0) || (iVar1 = BN_set_word(a,2), iVar1 == 0)) ||
        (iVar1 = BN_sub(r_00,in_RSI,a), iVar1 == 0)) ||
       (iVar1 = BN_mod_exp_mont((BIGNUM *)a,in_RDI,(BIGNUM *)r_00,(BIGNUM *)in_RSI,in_RDX,
                                (BN_MONT_CTX *)0x0), iVar1 == 0)) {
      BN_free(a);
      a = local_28;
    }
    local_28 = a;
    BN_CTX_end((BN_CTX *)in_RDX);
    local_8 = local_28;
  }
  return (BIGNUM *)local_8;
}

Assistant:

static BIGNUM *dsa_mod_inverse_fermat(const BIGNUM *k, const BIGNUM *q,
                                      BN_CTX *ctx)
{
    BIGNUM *res = NULL;
    BIGNUM *r, *e;

    if ((r = BN_new()) == NULL)
        return NULL;

    BN_CTX_start(ctx);
    if ((e = BN_CTX_get(ctx)) != NULL
            && BN_set_word(r, 2)
            && BN_sub(e, q, r)
            && BN_mod_exp_mont(r, k, e, q, ctx, NULL))
        res = r;
    else
        BN_free(r);
    BN_CTX_end(ctx);
    return res;
}